

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * SetNew(void)

{
  char *pcVar1;
  char *s;
  
  pcVar1 = (char *)calloc((long)size,1);
  if (pcVar1 == (char *)0x0) {
    memory_error();
  }
  return pcVar1;
}

Assistant:

char *SetNew(){
  char *s;
  s = (char*)calloc( size, 1);
  if( s==0 ){
    extern void memory_error();
    memory_error();
  }
  return s;
}